

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int nonce_function_bip340
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  int iVar1;
  long in_RCX;
  void *in_R9;
  long in_stack_00000008;
  int i;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar2;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_sha256 *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  secp256k1_sha256 *in_stack_ffffffffffffff50;
  int local_4;
  
  if (in_R9 == (void *)0x0) {
    local_4 = 0;
  }
  else {
    if (masked_key._0_8_ == 0) {
      for (iVar2 = 0; iVar2 < 0x20; iVar2 = iVar2 + 1) {
        (&stack0xffffffffffffff38)[iVar2] =
             *(byte *)(in_RCX + iVar2) ^ nonce_function_bip340::ZERO_MASK[iVar2];
      }
    }
    else {
      secp256k1_nonce_function_bip340_sha256_tagged_aux((secp256k1_sha256 *)0x4775c7);
      secp256k1_sha256_write
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      secp256k1_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      for (iVar2 = 0; iVar2 < 0x20; iVar2 = iVar2 + 1) {
        (&stack0xffffffffffffff38)[iVar2] =
             (&stack0xffffffffffffff38)[iVar2] ^ *(byte *)(in_RCX + iVar2);
      }
    }
    if ((in_stack_00000008 == 0xd) &&
       (iVar1 = secp256k1_memcmp_var(in_R9,"BIP0340/nonce",0xd), iVar1 == 0)) {
      secp256k1_nonce_function_bip340_sha256_tagged((secp256k1_sha256 *)0x4776ae);
    }
    else {
      secp256k1_sha256_initialize_tagged
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40);
    }
    secp256k1_sha256_write
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               CONCAT44(iVar2,in_stack_ffffffffffffff30));
    secp256k1_sha256_write
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               CONCAT44(iVar2,in_stack_ffffffffffffff30));
    secp256k1_sha256_write
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               CONCAT44(iVar2,in_stack_ffffffffffffff30));
    secp256k1_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    } else {
        /* Precomputed TaggedHash("BIP0340/aux", 0x0000...00); */
        static const unsigned char ZERO_MASK[32] = {
              84, 241, 105, 207, 201, 226, 229, 114,
             116, 128,  68,  31, 144, 186,  37, 196,
             136, 244,  97, 199,  11,  94, 165, 220,
             170, 247, 175, 105, 39,  10, 165,  20
        };
        for (i = 0; i < 32; i++) {
            masked_key[i] = key32[i] ^ ZERO_MASK[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (algolen == sizeof(bip340_algo)
            && secp256k1_memcmp_var(algo, bip340_algo, algolen) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash masked-key||pk||msg using the tagged hash as per the spec */
    secp256k1_sha256_write(&sha, masked_key, 32);
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}